

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O2

object __thiscall
boost::python::detail::
make_function_aux<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)(),boost::python::default_call_policies,boost::mpl::vector2<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&>,mpl_::int_<0>>
          (detail *this,first_type f,undefined8 p,undefined8 param_4,undefined8 param_5,
          pair *param_6)

{
  py_function local_30;
  caller<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&>_>
  local_28;
  
  local_28.super_type.m_data.
  super_compressed_pair_imp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_2>
  .first_ = f;
  local_28.super_type.m_data.
  super_compressed_pair_imp<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_(MlmWrap::*)(),_boost::python::default_call_policies,_2>
  ._8_8_ = p;
  objects::py_function::
  py_function<boost::python::detail::caller<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)(),boost::python::default_call_policies,boost::mpl::vector2<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&>>>
            (&local_30,&local_28);
  objects::function_object((objects *)this,&local_30,param_6);
  if (local_30.m_impl._M_t.
      super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_30.m_impl._M_t.
                          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          .
                          super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>
                          ._M_head_impl + 8))();
  }
  return (object)(object_base)this;
}

Assistant:

object make_function_aux(
      F f
      , CallPolicies const& p
      , Sig const&
      , detail::keyword_range const& kw // a [begin,end) pair of iterators over keyword names
      , NumKeywords                     // An MPL integral type wrapper: the size of kw
      )
  {
      enum { arity = mpl::size<Sig>::value - 1 };
      
      typedef typename detail::error::more_keywords_than_function_arguments<
          NumKeywords::value, arity
          >::too_many_keywords assertion BOOST_ATTRIBUTE_UNUSED;
    
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
        , kw);
  }